

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_preflight(int argc,char **argv,int unpack,fpstate *fpptr)

{
  char *__dest;
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  char outfits [513];
  char infits [513];
  undefined8 local_450;
  char local_448 [4];
  undefined2 uStack_444;
  undefined4 uStack_441;
  undefined1 uStack_43d;
  char local_23b [523];
  
  if (fpptr->initialized != 0x2a) {
    fp_msg("Error: internal initialization error\n");
LAB_00104bc9:
    exit(-1);
  }
  iVar1 = fpptr->firstfile;
  if (iVar1 < argc) {
    pcVar10 = fpptr->outfile;
    local_450 = fpptr->prefix;
    lVar9 = 0;
    __dest = local_23b + 3;
    bVar2 = false;
    do {
      local_448[0] = '\0';
      pcVar6 = argv[iVar1 + lVar9];
      sVar5 = strlen(pcVar6);
      if (0x1fd < sVar5) {
        fp_msg("Error: input file name\n   ");
        fp_msg(argv[iVar1 + lVar9]);
        pcVar10 = "\n   is too long\n";
LAB_00104bbf:
        fp_msg(pcVar10);
        fp_noop();
        goto LAB_00104bc9;
      }
      strncpy(__dest,pcVar6,0x201);
      cVar3 = local_23b[3];
      if ((local_23b[3] == '-') && (local_23b[4] != '\0')) {
        fp_msg("Error: invalid input file name\n   ");
        pcVar10 = argv[iVar1 + lVar9];
LAB_00104bb3:
        fp_msg(pcVar10);
        pcVar10 = "\n";
        goto LAB_00104bbf;
      }
      pcVar6 = strchr(__dest,0x5b);
      if ((pcVar6 != (char *)0x0) || (pcVar6 = strchr(__dest,0x5d), pcVar6 != (char *)0x0)) {
        pcVar10 = "Error: section/extension notation not supported: ";
LAB_00104b18:
        fp_msg(pcVar10);
        pcVar10 = local_23b + 3;
        goto LAB_00104bb3;
      }
      if (unpack != 0) {
        if (cVar3 != '-') {
          iVar4 = fp_access(__dest);
          if (iVar4 == 0) {
            sVar5 = strlen(__dest);
            sVar7 = strlen(__dest);
            builtin_strncpy(local_23b + sVar7 + 3,".fz",4);
            iVar4 = fp_access(__dest);
            local_23b[(long)(int)sVar5 + 3] = '\0';
            if (iVar4 == 0) {
              fp_msg("Error: ambiguous input file name.  Which file should be unpacked?:\n  ");
              fp_msg(local_23b + 3);
              fp_msg("\n  ");
              fp_msg(local_23b + 3);
              pcVar10 = ".fz\n";
              goto LAB_00104bbf;
            }
          }
          else {
            sVar5 = strlen(__dest);
            builtin_strncpy(local_23b + sVar5 + 3,".fz",4);
            iVar4 = fp_access(__dest);
            if (iVar4 != 0) goto LAB_00104b77;
          }
        }
        pcVar6 = local_450;
        if (fpptr->to_stdout != 0) goto LAB_0010497e;
        if (*pcVar10 != '\0') {
LAB_0010479c:
          if (bVar2) {
            fp_msg("Error: cannot use same output file name for multiple files:\n   ");
            goto LAB_00104bb3;
          }
          iVar4 = fp_access(pcVar10);
          bVar2 = true;
          if (iVar4 != 0) goto LAB_0010497e;
          fp_msg("Error: output file already exists:\n ");
          goto LAB_00104c63;
        }
        if (*local_450 != '\0') {
          sVar5 = strlen(local_450);
          sVar7 = strlen(__dest);
          if (0x200 < sVar7 + sVar5) {
            fp_msg("Error: output file name for\n   ");
            fp_msg(local_23b + 3);
            pcVar10 = "\n   is too long with the prefix\n";
            goto LAB_00104bbf;
          }
          strcpy(local_448,pcVar6);
        }
        cVar3 = local_23b[3];
        if (local_23b[3] == '-') {
          local_448[0] = 'o';
          stack0xfffffffffffffbb9 = 0x2e7475707475;
          uStack_441 = 0x73746966;
          uStack_43d = 0;
        }
        else {
          strcat(local_448,__dest);
        }
        sVar5 = strlen(local_448);
        uVar11 = (uint)sVar5;
        if (((int)uVar11 < 3) ||
           (iVar4 = strcmp(".gz",(char *)((long)&local_450 + (ulong)(uVar11 & 0x7fffffff) + 5)),
           iVar4 != 0)) {
          if (3 < (int)uVar11) {
            iVar4 = strcmp(".bz2",(char *)((long)&local_450 + (ulong)(uVar11 & 0x7fffffff) + 4));
            iVar8 = -4;
            if (iVar4 == 0) goto LAB_0010489f;
          }
        }
        else {
          iVar8 = -3;
LAB_0010489f:
          local_448[iVar8 + uVar11] = '\0';
        }
        if (cVar3 != '-') {
          sVar5 = strlen(local_448);
          uVar11 = (uint)sVar5;
          if (((int)uVar11 < 3) ||
             (iVar4 = strcmp(".fz",(char *)((long)&local_450 + (ulong)(uVar11 & 0x7fffffff) + 5)),
             iVar4 != 0)) {
            if (fpptr->delete_suffix != 0) {
              fp_msg("Error: input compressed file ");
              fp_msg(local_23b + 3);
              pcVar10 = "\n does not have the default .fz suffix.\n";
              goto LAB_00104bbf;
            }
          }
          else {
            local_448[uVar11 - 3] = '\0';
          }
        }
        iVar4 = strcmp(__dest,local_448);
        if ((iVar4 == 0) || (iVar4 = fp_access(local_448), iVar4 != 0)) {
          if (fpptr->do_gzip_file == 0) goto LAB_0010497e;
          sVar5 = strlen(local_448);
          if (0xfffffffffffffdfe < sVar5 - 0x1fe) {
            sVar5 = strlen(local_448);
            builtin_strncpy(local_448 + sVar5,".gz",4);
            iVar4 = fp_access(local_448);
            if (iVar4 == 0) goto LAB_00104ae6;
            sVar5 = strlen(local_448);
            local_448[(long)((sVar5 << 0x20) + -0x300000000) >> 0x20] = '\0';
            goto LAB_0010497e;
          }
LAB_00104c52:
          pcVar10 = "Error: output file name too long:\n ";
        }
        else {
LAB_00104ae6:
          pcVar10 = "Error: output file already exists:\n ";
        }
        fp_msg(pcVar10);
        pcVar10 = local_448;
LAB_00104c63:
        fp_msg(pcVar10);
        pcVar10 = "\n ";
        goto LAB_00104bbf;
      }
      if ((cVar3 != '-') && (iVar4 = fp_access(__dest), iVar4 != 0)) {
        sVar5 = strlen(__dest);
        if (0xfffffffffffffdfe < sVar5 - 0x1fe) {
          sVar5 = strlen(__dest);
          builtin_strncpy(local_23b + sVar5 + 3,".gz",4);
          iVar4 = fp_access(__dest);
          if (iVar4 != 0) {
LAB_00104b77:
            pcVar10 = local_23b + 3;
            sVar5 = strlen(pcVar10);
            local_23b[((long)((sVar5 << 0x20) + -0x300000000) >> 0x20) + 3] = '\0';
            fp_msg("Error: can\'t find or read input file ");
            goto LAB_00104bb3;
          }
          goto LAB_001046c9;
        }
        fp_msg("Error: input file name too long:\n ");
        pcVar10 = local_23b + 3;
        goto LAB_00104c63;
      }
LAB_001046c9:
      sVar5 = strlen(__dest);
      if ((2 < (int)(uint)sVar5) &&
         (iVar4 = strcmp(".fz",local_23b + ((uint)sVar5 & 0x7fffffff)), iVar4 == 0)) {
        pcVar10 = "Error: fpack input file already has \'.fz\' suffix\n";
        goto LAB_00104b18;
      }
      if ((fpptr->to_stdout == 0) && (fpptr->test_all == 0)) {
        if (*pcVar10 != '\0') goto LAB_0010479c;
        if (local_23b[3] == '-') {
          local_448[0] = 'i';
          stack0xfffffffffffffbb9 = 0x662e7475706e;
          uStack_441 = 0x737469;
        }
        else {
          strcpy(local_448,__dest);
        }
        sVar5 = strlen(local_448);
        uVar11 = (uint)sVar5;
        if (((int)uVar11 < 3) ||
           (iVar4 = strcmp(".gz",(char *)((long)&local_450 + (ulong)(uVar11 & 0x7fffffff) + 5)),
           iVar4 != 0)) {
          if (3 < (int)uVar11) {
            iVar4 = strcmp(".bz2",(char *)((long)&local_450 + (ulong)(uVar11 & 0x7fffffff) + 4));
            iVar8 = -4;
            if (iVar4 == 0) goto LAB_00104a17;
          }
        }
        else {
          iVar8 = -3;
LAB_00104a17:
          local_448[iVar8 + uVar11] = '\0';
        }
        sVar5 = strlen(local_448);
        uVar11 = (uint)sVar5;
        if ((3 < (int)uVar11) &&
           (iVar4 = strcmp(".imh",(char *)((long)&local_450 + (ulong)(uVar11 & 0x7fffffff) + 4)),
           iVar4 == 0)) {
          local_448[uVar11 - 4] = '\0';
          sVar5 = strlen(local_448);
          sVar7 = strlen(local_448);
          if (sVar5 == 0x1fc) {
            *(undefined1 *)((long)&uStack_444 + sVar7) = 0;
          }
          else {
            *(undefined2 *)((long)&uStack_444 + sVar7) = 0x73;
          }
          builtin_strncpy(local_448 + sVar7,".fit",4);
        }
        if (fpptr->clobber == 0) {
          sVar5 = strlen(local_448);
          if (0x1fd < sVar5) goto LAB_00104c52;
          sVar5 = strlen(local_448);
          builtin_strncpy(local_448 + sVar5,".fz",4);
        }
        iVar4 = strcmp(__dest,local_448);
        if ((iVar4 != 0) && (iVar4 = fp_access(local_448), iVar4 == 0)) goto LAB_00104ae6;
      }
LAB_0010497e:
      lVar9 = lVar9 + 1;
    } while (argc - iVar1 != (int)lVar9);
  }
  fpptr->preflight_checked = fpptr->preflight_checked + 1;
  return 0;
}

Assistant:

int fp_preflight (int argc, char *argv[], int unpack, fpstate *fpptr)
{
	char	infits[SZ_STR], outfits[SZ_STR];
	int	iarg, namelen, nfiles = 0;

	if (fpptr->initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	}

	for (iarg=fpptr->firstfile; iarg < argc; iarg++) {

            outfits[0] = '\0';
	    
            if (strlen(argv[iarg]) > SZ_STR - 4) {  /* allow for .fz or .gz suffix */
		    fp_msg ("Error: input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n   is too long\n"); fp_noop (); exit (-1);
	    }

	    strncpy (infits, argv[iarg], SZ_STR);
	    if (infits[0] == '-' && infits[1] != '\0') {  
	         /* don't interpret this as intending to read input file from stdin */
		    fp_msg ("Error: invalid input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n"); fp_noop (); exit (-1);
	    }

	    if (strchr (infits, '[') || strchr (infits, ']')) {
		fp_msg ("Error: section/extension notation not supported: ");
		fp_msg (infits); fp_msg ("\n"); fp_noop (); exit (-1);
	    }
	    
            if (unpack) {
	  	/* ********** This section applies to funpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	         if (fp_access (infits) != 0) {  /* if not, then check if */
		    strcat(infits, ".fz");       /* a .fz version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	         } else {   /* make sure a .fz version of the same file doesn't exist */
                    namelen = strlen(infits);
		    strcat(infits, ".fz");   
	            if (fp_access (infits) == 0) {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: ambiguous input file name.  Which file should be unpacked?:\n  ");
		        fp_msg (infits); fp_msg ("\n  "); 
		        fp_msg (infits); fp_msg (".fz\n"); 
		        fp_noop (); exit (-1);
                    } else {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		    }
	         }
	      }

              /* if writing to stdout, then we are all done */
	      if (fpptr->to_stdout) {
                      continue;
	      }

              if (fpptr->outfile[0]) {  /* user specified output file name */
	          nfiles++;
		  if (nfiles > 1) {
		      fp_msg ("Error: cannot use same output file name for multiple files:\n   ");
		      fp_msg (fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
	          }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
	      }     

	      /* construct output file name to test */
	      if (fpptr->prefix[0]) {
                  if (strlen(fpptr->prefix) + strlen(infits) > SZ_STR - 1) {
		      fp_msg ("Error: output file name for\n   "); fp_msg (infits);
		      fp_msg ("\n   is too long with the prefix\n"); fp_noop (); exit (-1);
	          }
	          strcpy(outfits,fpptr->prefix);
	      }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "output.fits");
	      } else {
	        strcat(outfits, infits);
	      }

	      /* remove .gz or .bz2 suffix, if present (output is not gzipped) */
              namelen = strlen(outfits);
	      if (namelen >= 3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }

	      /* check for .fz suffix that is sometimes required */
	      /* and remove it if present */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
                 namelen = strlen(outfits);
	         if (namelen>=3 && !strcmp(".fz", outfits + namelen - 3) ) { /* suffix is present */
                        outfits[namelen - 3] = '\0';
	         } else if (fpptr->delete_suffix) {  /* required suffix is missing */
		    fp_msg ("Error: input compressed file "); fp_msg (infits);
		    fp_msg ("\n does not have the default .fz suffix.\n"); 
		    fp_noop (); exit (-1);
	         }
	      }

	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }

	      /* if gzipping the output, make sure .gz file doesn't exist */
	      if (fpptr->do_gzip_file) {
                        if (strlen(outfits)+3 > SZ_STR-1)
                        {
		            fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
                        }
	                strcat(outfits, ".gz");
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
              		namelen = strlen(outfits);
                        outfits[namelen - 3] = '\0';  /* remove the .gz suffix again */
	      }
	  } else {
	  	/* ********** This section applies to fpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	        if (fp_access (infits) != 0) {  /* if not, then check if */
                    if (strlen(infits)+3 > SZ_STR-1)
                    {
		        fp_msg ("Error: input file name too long:\n "); fp_msg (infits);
		        fp_msg ("\n "); fp_noop (); exit (-1);
                    }
		    strcat(infits, ".gz");     /* a gzipped version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .gz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	        }
	      }

              /* make sure the file to pack does not already have a .fz suffix */
              namelen = strlen(infits);
	      if (namelen>=3 && !strcmp(".fz", infits + namelen - 3) ) {
		        fp_msg ("Error: fpack input file already has '.fz' suffix\n" ); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
	      }

              /* if writing to stdout, or just testing the files, then we are all done */
	      if (fpptr->to_stdout || fpptr->test_all) {
                        continue;
	      }
              
              if (fpptr->outfile[0]) { /* user specified output file name */
                  nfiles++;
                  if (nfiles > 1) {
                      fp_msg("Error: cannot use same output file name for multiple files:\n   ");
                      fp_msg(fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
                  }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
              }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "input.fits");
	      } else {
	        strcpy(outfits, infits);
	      }

	      /* remove .gz suffix, if present (output is not gzipped) */
              /* do the same if compression suffix is bz2 */
              namelen = strlen(outfits);
	      if (namelen >=3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }
              
	      
	      /* remove .imh suffix (IRAF format image), and replace with .fits */
              namelen = strlen(outfits);
	      if (namelen >=4 && !strcmp(".imh", outfits + namelen - 4) ) {
                        outfits[namelen - 4] = '\0';
                        if (strlen(outfits) == SZ_STR-5)
                           strcat(outfits, ".fit");
                        else
                           strcat(outfits, ".fits");
	      }

	      /* If not clobbering the input file, add .fz suffix to output name */
	      if (! fpptr->clobber)
              {
                 if (strlen(outfits) > SZ_STR-4)
                 {
		    fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		    fp_msg ("\n "); fp_noop (); exit (-1);
                 }
                 else
		     strcat(outfits, ".fz");
              }
			
	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }
	  }   /* end of fpack section */
	}

	fpptr->preflight_checked++;
	return(0);
}